

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

DiyFp __thiscall FIX::double_conversion::Double::AsDiyFp(Double *this)

{
  bool bVar1;
  int iVar2;
  uint64_t significand;
  DiyFp DVar3;
  Double *this_local;
  undefined4 local_10;
  
  iVar2 = Sign(this);
  if (iVar2 < 1) {
    __assert_fail("Sign() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                  ,0x3c,"DiyFp FIX::double_conversion::Double::AsDiyFp() const");
  }
  bVar1 = IsSpecial(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsSpecial()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/ieee.h"
                  ,0x3d,"DiyFp FIX::double_conversion::Double::AsDiyFp() const");
  }
  significand = Significand(this);
  iVar2 = Exponent(this);
  DiyFp::DiyFp((DiyFp *)&this_local,significand,iVar2);
  DVar3._12_4_ = 0;
  DVar3.f_ = (uint64_t)this_local;
  DVar3.e_ = local_10;
  return DVar3;
}

Assistant:

DiyFp AsDiyFp() const {
    ASSERT(Sign() > 0);
    ASSERT(!IsSpecial());
    return DiyFp(Significand(), Exponent());
  }